

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.c
# Opt level: O0

void setup_ignored_signals(sigaction *signal_action,int flags)

{
  int iVar1;
  uint in_ESI;
  sigaction *in_RDI;
  
  (in_RDI->__sigaction_handler).sa_handler = signal_handler;
  if (((in_ESI & 1) == 0) && (iVar1 = sigaction(10,in_RDI,(sigaction *)0x0), iVar1 != 0)) {
    throw((char *)0x1023dc);
  }
  if (((in_ESI & 2) == 0) && (iVar1 = sigaction(0xc,in_RDI,(sigaction *)0x0), iVar1 != 0)) {
    throw((char *)0x10240e);
  }
  return;
}

Assistant:

void setup_ignored_signals(struct sigaction *signal_action, int flags) {
	// Now ignore the other signals
	signal_action->sa_handler = signal_handler;

	// Ignore SIGUSR1 ?
	if (!(flags & BLOCK_USR1)) {
		// Set signal handler
		if (sigaction(SIGUSR1, signal_action, NULL)) {
			throw("Error registering SIGUSR1 signal handler for server");
		}
	}

	// Ignore SIGUSR2 ?
	if (!(flags & BLOCK_USR2)) {
		// Set signal handler
		if (sigaction(SIGUSR2, signal_action, NULL)) {
			throw("Error registering SIGUSR2 signal handler for server");
		}
	}
}